

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

void Qiniu_Mac_HmacV2(Qiniu_Mac *mac,char *method,char *host,char *path,char *contentType,
                     Qiniu_Found_X_Qiniu_Header *x_header,int x_header_count,char *addition,
                     size_t addlen,char *digest,uint *digest_len)

{
  size_t items_len;
  char **items_00;
  long lVar1;
  ulong local_a0;
  size_t i;
  char **new_items;
  size_t new_items_count;
  size_t new_items_offset;
  size_t count;
  char *items [8];
  Qiniu_Found_X_Qiniu_Header *x_header_local;
  char *contentType_local;
  char *path_local;
  char *host_local;
  char *method_local;
  Qiniu_Mac *mac_local;
  
  items[0] = " ";
  items[2] = "\nHost: ";
  items[4] = "\nContent-Type: ";
  items[6] = "\n";
  count = (size_t)method;
  items[1] = path;
  items[3] = host;
  items[5] = contentType;
  items[7] = (char *)x_header;
  if (x_header == (Qiniu_Found_X_Qiniu_Header *)0x0) {
    Qiniu_Mac_Hmac_inner(mac,(char **)&count,8,addition,addlen,digest,digest_len);
  }
  else {
    new_items_count = 8;
    items_len = (long)(x_header_count << 2) + 8;
    items_00 = (char **)malloc(items_len * 8);
    memcpy(items_00,&count,0x40);
    for (local_a0 = 0; local_a0 < (ulong)(long)x_header_count; local_a0 = local_a0 + 1) {
      items_00[new_items_count] = *(char **)(items[7] + local_a0 * 0x20);
      items_00[new_items_count + 1] = ": ";
      lVar1 = new_items_count + 3;
      items_00[new_items_count + 2] = *(char **)(items[7] + local_a0 * 0x20 + 8);
      new_items_count = new_items_count + 4;
      items_00[lVar1] = "\n";
    }
    Qiniu_Mac_Hmac_inner(mac,items_00,items_len,addition,addlen,digest,digest_len);
    Qiniu_Free(items_00);
  }
  return;
}

Assistant:

static void Qiniu_Mac_HmacV2(
	Qiniu_Mac *mac, const char *method, const char *host, const char *path, const char *contentType,
	Qiniu_Found_X_Qiniu_Header *x_header, int x_header_count,
	const char *addition, size_t addlen, char *digest, unsigned int *digest_len)
{
	const char *items[] = {method, " ", path, "\nHost: ", host, "\nContent-Type: ", contentType, "\n"};
	if (x_header == NULL)
	{
		size_t count = sizeof(items) / sizeof(const char *);
		Qiniu_Mac_Hmac_inner(mac, items, count, addition, addlen, digest, digest_len);
	}
	else
	{
		size_t new_items_offset = sizeof(items) / sizeof(const char *);
		size_t new_items_count = new_items_offset + x_header_count * 4;
		const char **new_items = (const char **)malloc(new_items_count * sizeof(char *));
		memcpy(new_items, items, sizeof(items));
		for (size_t i = 0; i < x_header_count; i++)
		{
			new_items[new_items_offset++] = x_header[i].header_name;
			new_items[new_items_offset++] = ": ";
			new_items[new_items_offset++] = x_header[i].header_value;
			new_items[new_items_offset++] = "\n";
		}
		Qiniu_Mac_Hmac_inner(mac, new_items, new_items_count, addition, addlen, digest, digest_len);
		Qiniu_Free(new_items);
	}
}